

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * rbuObjIterGetWhere(sqlite3rbu *p,RbuObjIter *pIter)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar1 = pIter->eType;
  if ((iVar1 != 1) && (iVar1 != 5)) {
    pcVar3 = "";
    if (iVar1 == 3) {
      pcVar2 = (char *)0x0;
      for (uVar4 = 0; (long)uVar4 < (long)pIter->nTblCol; uVar4 = uVar4 + 1) {
        if (pIter->abTblPk[uVar4] != '\0') {
          pcVar2 = rbuMPrintf(p,"%z%sc%d=?%d",pcVar2,pcVar3,uVar4 & 0xffffffff,
                              (ulong)((int)uVar4 + 1));
          pcVar3 = " AND ";
        }
      }
      pcVar3 = rbuMPrintf(p,"_rowid_ = (SELECT id FROM rbu_imposter2 WHERE %z)",pcVar2,pcVar3);
      return pcVar3;
    }
    uVar4 = 0;
    pcVar2 = (char *)0x0;
    do {
      do {
        uVar5 = uVar4;
        uVar4 = uVar5 + 1;
        if ((long)pIter->nTblCol <= (long)uVar5) {
          return pcVar2;
        }
      } while (pIter->abTblPk[uVar5] == '\0');
      pcVar2 = rbuMPrintf(p,"%z%s\"%w\"=?%d",pcVar2,pcVar3,pIter->azTblCol[uVar5],uVar4 & 0xffffffff
                         );
      pcVar3 = " AND ";
    } while( true );
  }
  pcVar3 = rbuMPrintf(p,"_rowid_ = ?%d",(ulong)(pIter->nTblCol + 1));
  return pcVar3;
}

Assistant:

static char *rbuObjIterGetWhere(
  sqlite3rbu *p, 
  RbuObjIter *pIter
){
  char *zList = 0;
  if( pIter->eType==RBU_PK_VTAB || pIter->eType==RBU_PK_NONE ){
    zList = rbuMPrintf(p, "_rowid_ = ?%d", pIter->nTblCol+1);
  }else if( pIter->eType==RBU_PK_EXTERNAL ){
    const char *zSep = "";
    int i;
    for(i=0; i<pIter->nTblCol; i++){
      if( pIter->abTblPk[i] ){
        zList = rbuMPrintf(p, "%z%sc%d=?%d", zList, zSep, i, i+1);
        zSep = " AND ";
      }
    }
    zList = rbuMPrintf(p, 
        "_rowid_ = (SELECT id FROM rbu_imposter2 WHERE %z)", zList
    );

  }else{
    const char *zSep = "";
    int i;
    for(i=0; i<pIter->nTblCol; i++){
      if( pIter->abTblPk[i] ){
        const char *zCol = pIter->azTblCol[i];
        zList = rbuMPrintf(p, "%z%s\"%w\"=?%d", zList, zSep, zCol, i+1);
        zSep = " AND ";
      }
    }
  }
  return zList;
}